

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataTypeRegister.cpp
# Opt level: O3

bool __thiscall
Rml::TransformFuncRegister::Call
          (TransformFuncRegister *this,String *name,VariantList *arguments,Variant *out_result)

{
  Node *pNVar1;
  code *pcVar2;
  bool bVar3;
  size_t sVar4;
  Node *pNVar5;
  Variant local_50;
  
  sVar4 = robin_hood::detail::
          Table<true,80ul,std::__cxx11::string,std::function<Rml::Variant(std::vector<Rml::Variant,std::allocator<Rml::Variant>>const&)>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
          ::findIdx<std::__cxx11::string>
                    ((Table<true,80ul,std::__cxx11::string,std::function<Rml::Variant(std::vector<Rml::Variant,std::allocator<Rml::Variant>>const&)>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                      *)this,name);
  pNVar5 = (this->transform_functions).mKeyVals + sVar4;
  pNVar1 = (Node *)(this->transform_functions).mInfo;
  if (pNVar5 != pNVar1) {
    if ((pNVar5->mData).second.super__Function_base._M_manager == (_Manager_type)0x0) {
      bVar3 = Assert("RMLUI_ASSERT(transform_func)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataTypeRegister.cpp"
                     ,0x7d);
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      if ((pNVar5->mData).second.super__Function_base._M_manager == (_Manager_type)0x0) {
        ::std::__throw_bad_function_call();
      }
    }
    (*(pNVar5->mData).second._M_invoker)(&local_50,(_Any_data *)&(pNVar5->mData).second,arguments);
    Variant::operator=(out_result,&local_50);
    Variant::~Variant(&local_50);
  }
  return pNVar5 != pNVar1;
}

Assistant:

bool TransformFuncRegister::Call(const String& name, const VariantList& arguments, Variant& out_result) const
{
	auto it = transform_functions.find(name);
	if (it == transform_functions.end())
		return false;

	const DataTransformFunc& transform_func = it->second;
	RMLUI_ASSERT(transform_func);

	out_result = transform_func(arguments);
	return true;
}